

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

void __thiscall
pugi::impl::anon_unknown_0::xpath_ast_node::
step_fill<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)1>_>
          (xpath_ast_node *this,xpath_node *ns,xpath_allocator *xn,undefined8 alloc,byte once)

{
  xpath_node *pxVar1;
  unspecified_bool_type p_Var2;
  xml_node_struct *pxVar3;
  unspecified_bool_type p_Var4;
  xml_attribute_struct *pxVar5;
  bool bVar6;
  xml_node local_78;
  xml_attribute local_70;
  xml_node local_68;
  xml_attribute local_60 [2];
  xml_node local_50;
  xml_node local_48;
  undefined1 local_39;
  undefined4 local_38;
  bool axis_has_attributes;
  axis_t axis;
  bool once_local;
  xpath_allocator *alloc_local;
  xpath_node *xn_local;
  xpath_node_set_raw *ns_local;
  xpath_ast_node *this_local;
  
  axis_has_attributes = (bool)(once & 1);
  local_38 = 1;
  local_39 = 1;
  _axis = alloc;
  alloc_local = xn;
  xn_local = ns;
  ns_local = (xpath_node_set_raw *)this;
  local_48 = xpath_node::node((xpath_node *)xn);
  p_Var2 = xml_node::operator_cast_to_function_pointer(&local_48);
  pxVar1 = xn_local;
  if (p_Var2 == (unspecified_bool_type)0x0) {
    local_60[0] = xpath_node::attribute((xpath_node *)alloc_local);
    p_Var4 = xml_attribute::operator_cast_to_function_pointer(local_60);
    bVar6 = false;
    if (p_Var4 != (unspecified_bool_type)0x0) {
      local_68 = xpath_node::parent((xpath_node *)alloc_local);
      p_Var2 = xml_node::operator_cast_to_function_pointer(&local_68);
      bVar6 = p_Var2 != (unspecified_bool_type)0x0;
    }
    pxVar1 = xn_local;
    if (bVar6) {
      local_70 = xpath_node::attribute((xpath_node *)alloc_local);
      pxVar5 = xml_attribute::internal_object(&local_70);
      local_78 = xpath_node::parent((xpath_node *)alloc_local);
      pxVar3 = xml_node::internal_object(&local_78);
      step_fill<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)1>_>
                (this,pxVar1,pxVar5,pxVar3,_axis,axis_has_attributes & 1);
    }
  }
  else {
    local_50 = xpath_node::node((xpath_node *)alloc_local);
    pxVar3 = xml_node::internal_object(&local_50);
    step_fill<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)1>_>
              (this,pxVar1,pxVar3,_axis,axis_has_attributes & 1);
  }
  return;
}

Assistant:

void step_fill(xpath_node_set_raw& ns, const xpath_node& xn, xpath_allocator* alloc, bool once, T v)
		{
			const axis_t axis = T::axis;
			const bool axis_has_attributes = (axis == axis_ancestor || axis == axis_ancestor_or_self || axis == axis_descendant_or_self || axis == axis_following || axis == axis_parent || axis == axis_preceding || axis == axis_self);

			if (xn.node())
				step_fill(ns, xn.node().internal_object(), alloc, once, v);
			else if (axis_has_attributes && xn.attribute() && xn.parent())
				step_fill(ns, xn.attribute().internal_object(), xn.parent().internal_object(), alloc, once, v);
		}